

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O0

void __thiscall net_tests::cnetaddr_unserialize_v2::test_method(cnetaddr_unserialize_v2 *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  ParamsWrapper<CAddress::SerParams,_CNetAddr> PVar3;
  array<std::byte,_13UL> aVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd188;
  char *in_stack_ffffffffffffd190;
  char *in_stack_ffffffffffffd198;
  CNetAddr *in_stack_ffffffffffffd1a0;
  lazy_ostream *in_stack_ffffffffffffd1b0;
  undefined7 in_stack_ffffffffffffd1b8;
  undefined1 in_stack_ffffffffffffd1bf;
  const_string *in_stack_ffffffffffffd1c0;
  const_string *file;
  undefined7 in_stack_ffffffffffffd1c8;
  undefined1 in_stack_ffffffffffffd1cf;
  CNetAddr *in_stack_ffffffffffffd1d0;
  failure *ex_7;
  failure *ex_6;
  failure *ex_5;
  failure *ex_4;
  failure *ex_3;
  failure *ex_2;
  failure *ex_1;
  failure *ex;
  cnetaddr_unserialize_v2 *this_local;
  const_string local_23d0 [2];
  lazy_ostream local_23b0 [2];
  assertion_result local_2390 [2];
  const_string local_2358 [2];
  lazy_ostream local_2338 [2];
  assertion_result local_2318 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_22e0;
  const_string local_22d0 [2];
  lazy_ostream local_22b0 [2];
  assertion_result local_2290 [2];
  const_string local_2258 [2];
  lazy_ostream local_2238 [2];
  assertion_result local_2218 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_21e0;
  const_string local_21d0 [2];
  lazy_ostream local_21b0 [2];
  assertion_result local_2190 [7];
  const_string local_20e8;
  lazy_ostream local_20d8 [2];
  assertion_result local_20b8 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_2080;
  undefined5 local_2050;
  undefined3 uStack_204b;
  undefined4 local_2048;
  byte local_2044;
  const_string local_2040 [2];
  lazy_ostream local_2020 [2];
  assertion_result local_2000 [7];
  const_string local_1f58;
  lazy_ostream local_1f48 [2];
  assertion_result local_1f28 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1ef0;
  const_string local_1ec0 [2];
  lazy_ostream local_1ea0 [2];
  assertion_result local_1e80 [2];
  const_string local_1e48 [2];
  lazy_ostream local_1e28 [2];
  assertion_result local_1e08 [2];
  const_string local_1dd0 [2];
  lazy_ostream local_1db0 [2];
  assertion_result local_1d90 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1d58;
  const_string local_1d48 [2];
  lazy_ostream local_1d28 [2];
  assertion_result local_1d08 [2];
  undefined1 local_1cd0 [16];
  undefined1 local_1cc0 [64];
  const_string local_1c80 [2];
  lazy_ostream local_1c60 [2];
  assertion_result local_1c40 [2];
  const_string local_1c08 [2];
  lazy_ostream local_1be8 [2];
  assertion_result local_1bc8 [2];
  const_string local_1b90 [2];
  lazy_ostream local_1b70 [2];
  assertion_result local_1b50 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1b18;
  const_string local_1b08 [2];
  lazy_ostream local_1ae8 [2];
  assertion_result local_1ac8 [7];
  const_string local_1a20;
  lazy_ostream local_1a10 [2];
  assertion_result local_19f0 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_19b8;
  const_string local_1988 [2];
  lazy_ostream local_1968 [2];
  assertion_result local_1948 [2];
  undefined1 local_1910 [16];
  undefined1 local_1900 [64];
  const_string local_18c0 [2];
  lazy_ostream local_18a0 [2];
  assertion_result local_1880 [2];
  const_string local_1848 [2];
  lazy_ostream local_1828 [2];
  assertion_result local_1808 [2];
  const_string local_17d0 [2];
  lazy_ostream local_17b0 [2];
  assertion_result local_1790 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1758;
  const_string local_1748 [2];
  lazy_ostream local_1728 [2];
  assertion_result local_1708 [7];
  const_string local_1660;
  lazy_ostream local_1650 [2];
  assertion_result local_1630 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_15f8;
  const_string local_15c8 [2];
  lazy_ostream local_15a8 [2];
  assertion_result local_1588 [2];
  undefined1 local_1550 [16];
  undefined1 local_1540 [64];
  const_string local_1500 [2];
  lazy_ostream local_14e0 [2];
  assertion_result local_14c0 [2];
  const_string local_1488 [2];
  lazy_ostream local_1468 [2];
  assertion_result local_1448 [2];
  const_string local_1410 [2];
  lazy_ostream local_13f0 [2];
  assertion_result local_13d0 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1398;
  const_string local_1388 [2];
  lazy_ostream local_1368 [2];
  assertion_result local_1348 [2];
  const_string local_1310 [2];
  lazy_ostream local_12f0 [2];
  assertion_result local_12d0 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1298;
  _Type local_1288;
  const_string local_1278 [2];
  lazy_ostream local_1258 [2];
  assertion_result local_1238 [2];
  const_string local_1200 [2];
  lazy_ostream local_11e0 [2];
  assertion_result local_11c0 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1188;
  const_string local_1178 [2];
  lazy_ostream local_1158 [2];
  assertion_result local_1138 [2];
  const_string local_1100 [2];
  lazy_ostream local_10e0 [2];
  assertion_result local_10c0 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_1088;
  const_string local_1078 [2];
  lazy_ostream local_1058 [2];
  assertion_result local_1038 [2];
  undefined8 local_1000;
  const_string local_f90;
  lazy_ostream local_f80 [2];
  assertion_result local_f60 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_f28;
  const_string local_ef8 [2];
  lazy_ostream local_ed8 [2];
  assertion_result local_eb8 [2];
  undefined1 local_e80 [16];
  undefined1 local_e70 [64];
  const_string local_e30 [2];
  lazy_ostream local_e10 [2];
  assertion_result local_df0 [2];
  const_string local_db8 [2];
  lazy_ostream local_d98 [2];
  assertion_result local_d78 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_d40;
  const_string local_d30 [2];
  lazy_ostream local_d10 [2];
  assertion_result local_cf0 [2];
  undefined1 local_cb8 [16];
  undefined1 local_ca8 [64];
  const_string local_c68 [2];
  lazy_ostream local_c48 [2];
  assertion_result local_c28 [2];
  const_string local_bf0 [2];
  lazy_ostream local_bd0 [2];
  assertion_result local_bb0 [2];
  const_string local_b78 [2];
  lazy_ostream local_b58 [2];
  assertion_result local_b38 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_b00;
  const_string local_af0 [2];
  lazy_ostream local_ad0 [2];
  assertion_result local_ab0 [7];
  const_string local_a08;
  lazy_ostream local_9f8 [2];
  assertion_result local_9d8 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_9a0;
  const_string local_970 [2];
  lazy_ostream local_950 [2];
  assertion_result local_930 [7];
  const_string local_888;
  lazy_ostream local_878 [2];
  assertion_result local_858 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_820;
  const_string local_7f0 [2];
  lazy_ostream local_7d0 [2];
  assertion_result local_7b0 [7];
  const_string local_708;
  lazy_ostream local_6f8 [2];
  assertion_result local_6d8 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_6a0;
  const_string local_670 [2];
  lazy_ostream local_650 [2];
  assertion_result local_630 [2];
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [64];
  const_string local_5a8 [2];
  lazy_ostream local_588 [2];
  assertion_result local_568 [2];
  const_string local_530 [2];
  lazy_ostream local_510 [2];
  assertion_result local_4f0 [2];
  const_string local_4b8 [2];
  lazy_ostream local_498 [2];
  assertion_result local_478 [2];
  ParamsWrapper<CAddress::SerParams,_CNetAddr> local_440;
  SerParams ser_params;
  DataStream s;
  undefined1 local_338 [120];
  undefined1 local_2c0 [136];
  undefined1 local_238 [72];
  _Type local_1f0;
  undefined1 local_180 [56];
  undefined1 local_148 [120];
  _Type local_d0;
  undefined1 local_48 [32];
  CNetAddr addr;
  
  local_1000 = 0;
  local_2000[0].p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_2000[0]._1_7_ = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr((CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffd188);
  ser_params.super_SerParams.enc = V2;
  ser_params.fmt = Network;
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<13UL>___1,_4,_1,_2,_3,_4___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_6UL> *)in_stack_ffffffffffffd190);
  local_440 = CAddress::SerParams::operator()
                        ((SerParams *)in_stack_ffffffffffffd198,
                         (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_478,local_498,local_4b8,0x198,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsIPv4((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4f0,local_510,local_530,0x199,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsAddrV1Compatible((CNetAddr *)in_stack_ffffffffffffd190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_568,local_588,local_5a8,0x19a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [1])in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffd1d0);
    in_stack_ffffffffffffd198 = "\"1.2.3.4\"";
    in_stack_ffffffffffffd190 = "1.2.3.4";
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c143f5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_5e8,local_5f8,0x19b,1,2,local_48);
    std::__cxx11::string::~string(in_stack_ffffffffffffd188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_630,local_650,local_670,0x19c,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<9UL>___1,_4,_1,_2___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_4UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_6a0 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_6d8,local_6f8,&local_708,0x1a2,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b0,local_7d0,local_7f0,0x1a3,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<13UL>___1,_5,_1,_2,_3,_4___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_6UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_820 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_858,local_878,&local_888,0x1ab,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_930,local_950,local_970,0x1ac,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  local_d0 = (_Type)util::hex_literals::
                    operator___hex<util::hex_literals::detail::Hex<17UL>___1,_253,_1,_2,_1,_2,_3,_4___>
                              ();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_8UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_9a0 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_9d8,local_9f8,&local_a08,0x1b4,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ab0,local_ad0,local_af0,0x1b5,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<37UL>___2,_16,_1,_2,_3,_4,_5,_6,_7,_8,_______>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_18UL> *)in_stack_ffffffffffffd190);
  local_b00 = CAddress::SerParams::operator()
                        ((SerParams *)in_stack_ffffffffffffd198,
                         (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b38,local_b58,local_b78,0x1bd,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsIPv6((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bb0,local_bd0,local_bf0,0x1be,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsAddrV1Compatible((CNetAddr *)in_stack_ffffffffffffd190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c28,local_c48,local_c68,0x1bf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [1])in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffd1d0);
    in_stack_ffffffffffffd198 = "\"102:304:506:708:90a:b0c:d0e:f10\"";
    in_stack_ffffffffffffd190 = "102:304:506:708:90a:b0c:d0e:f10";
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c143f5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[32]>
              (local_ca8,local_cb8,0x1c0,1,2,local_148);
    std::__cxx11::string::~string(in_stack_ffffffffffffd188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cf0,local_d10,local_d30,0x1c1,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<37UL>___2,_16,_253,_107,_136,_192,_135,_36,_202,_151,_______>
            ();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_18UL> *)in_stack_ffffffffffffd190);
  local_d40 = CAddress::SerParams::operator()
                        ((SerParams *)in_stack_ffffffffffffd198,
                         (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsInternal((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d78,local_d98,local_db8,0x1c9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsAddrV1Compatible((CNetAddr *)in_stack_ffffffffffffd190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_df0,local_e10,local_e30,0x1ca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [1])in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffd1d0);
    in_stack_ffffffffffffd198 = "\"zklycewkdo64v6wc.internal\"";
    in_stack_ffffffffffffd190 = "zklycewkdo64v6wc.internal";
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c143f5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[26]>
              (local_e70,local_e80,0x1cb,1,2,local_180);
    std::__cxx11::string::~string(in_stack_ffffffffffffd188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_eb8,local_ed8,local_ef8,0x1cc,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<7UL>___2,_4,_0___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_3UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_f28 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_f60,local_f80,&local_f90,0x1d3,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1038,local_1058,local_1078,0x1d4,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<37UL>___2,_16,_0,_0,_0,_0,_0,_0,_0,_0,_______>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_18UL> *)in_stack_ffffffffffffd190);
  local_1088 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10c0,local_10e0,local_1100,0x1dc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1138,local_1158,local_1178,0x1dd,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<37UL>___2,_16,_253,_135,_216,_126,_235,_67,_1,_2,_______>
            ();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_18UL> *)in_stack_ffffffffffffd190);
  local_1188 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11c0,local_11e0,local_1200,0x1e4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1238,local_1258,local_1278,0x1e5,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_1288 = (_Type)util::hex_literals::
                      operator___hex<util::hex_literals::detail::Hex<25UL>___3,_10,_241,_242,_243,_244,_245,_246,_247,_248,_______>
                                ();
  local_1f0 = local_1288;
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_12UL> *)in_stack_ffffffffffffd190);
  local_1298 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_12d0,local_12f0,local_1310,0x1ec,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1348,local_1368,local_1388,0x1ed,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<69UL>___4,_32,_121,_188,_198,_37,_24,_75,_5,_25,_______>
            ();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_34UL> *)in_stack_ffffffffffffd190);
  local_1398 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_13d0,local_13f0,local_1410,0x1f5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsTor((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1448,local_1468,local_1488,0x1f6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsAddrV1Compatible((CNetAddr *)in_stack_ffffffffffffd190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_14c0,local_14e0,local_1500,0x1f7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [1])in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffd1d0);
    in_stack_ffffffffffffd198 = "\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\""
    ;
    in_stack_ffffffffffffd190 = "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion";
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c143f5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[63]>
              (local_1540,local_1550,0x1f9,1,2,local_238);
    std::__cxx11::string::~string(in_stack_ffffffffffffd188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1588,local_15a8,local_15c8,0x1fa,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<7UL>___4,_0,_0___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_3UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_15f8 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1630,local_1650,&local_1660,0x201,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1708,local_1728,local_1748,0x202,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<69UL>___5,_32,_162,_137,_77,_171,_174,_192,_140,_0,_______>
            ();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_34UL> *)in_stack_ffffffffffffd190);
  local_1758 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1790,local_17b0,local_17d0,0x20b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsI2P((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1808,local_1828,local_1848,0x20c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsAddrV1Compatible((CNetAddr *)in_stack_ffffffffffffd190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1880,local_18a0,local_18c0,0x20d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [1])in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffd1d0);
    in_stack_ffffffffffffd198 = "\"ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p\"";
    in_stack_ffffffffffffd190 = "ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p";
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c143f5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[61]>
              (local_1900,local_1910,0x20f,1,2,local_2c0);
    std::__cxx11::string::~string(in_stack_ffffffffffffd188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1948,local_1968,local_1988,0x210,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<7UL>___5,_3,_0___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_3UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_19b8 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_19f0,local_1a10,&local_1a20,0x217,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1ac8,local_1ae8,local_1b08,0x218,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<37UL>___6,_16,_252,_0,_0,_1,_0,_2,_0,_3,_______>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_18UL> *)in_stack_ffffffffffffd190);
  local_1b18 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1b50,local_1b70,local_1b90,0x220,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsCJDNS((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1bc8,local_1be8,local_1c08,0x221,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsAddrV1Compatible((CNetAddr *)in_stack_ffffffffffffd190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1c40,local_1c60,local_1c80,0x222,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [1])in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    CNetAddr::ToStringAddr_abi_cxx11_(in_stack_ffffffffffffd1d0);
    in_stack_ffffffffffffd198 = "\"fc00:1:2:3:4:5:6:7\"";
    in_stack_ffffffffffffd190 = "fc00:1:2:3:4:5:6:7";
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c143f5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[19]>
              (local_1cc0,local_1cd0,0x223,1,2,local_338);
    std::__cxx11::string::~string(in_stack_ffffffffffffd188);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d08,local_1d28,local_1d48,0x224,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<37UL>___6,_16,_170,_0,_0,_1,_0,_2,_0,_3,_______>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_18UL> *)in_stack_ffffffffffffd190);
  local_1d58 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsCJDNS((CNetAddr *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1d90,local_1db0,local_1dd0,0x22b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e08,local_1e28,local_1e48,0x22c,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1e80,local_1ea0,local_1ec0,0x22d,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<7UL>___6,_1,_0___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_3UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_1ef0 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_1f28,local_1f48,&local_1f58,0x234,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2000,local_2020,local_2040,0x235,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  aVar4 = util::hex_literals::
          operator___hex<util::hex_literals::detail::Hex<27UL>___170,_254,_0,_0,_0,_2,_1,_2,_3,_4,_______>
                    ();
  local_2048 = aVar4._M_elems._8_4_;
  local_2044 = aVar4._M_elems[0xc];
  local_2050 = aVar4._M_elems._0_5_;
  uStack_204b = aVar4._M_elems._5_3_;
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_13UL> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    PVar3 = CAddress::SerParams::operator()
                      ((SerParams *)in_stack_ffffffffffffd198,(CNetAddr *)in_stack_ffffffffffffd190)
    ;
    local_2080 = PVar3;
    DataStream::operator>>
              ((DataStream *)in_stack_ffffffffffffd198,
               (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
                 in_stack_ffffffffffffd1c0,
                 CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
                 (const_string *)in_stack_ffffffffffffd1b0);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffd198,
                 SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_ffffffffffffd190,(char (*) [57])in_stack_ffffffffffffd188)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
                 (unsigned_long)in_stack_ffffffffffffd188);
      in_stack_ffffffffffffd188 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_20b8,local_20d8,&local_20e8,0x23d,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[57],_const_char_(&)[57]>
                          *)in_stack_ffffffffffffd188);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_ffffffffffffd188);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar2);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2190,local_21b0,local_21d0,0x23e,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::clear((DataStream *)in_stack_ffffffffffffd188);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<13UL>___170,_4,_1,_2,_3,_4___>
            ();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_6UL> *)in_stack_ffffffffffffd190);
  local_21e0 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2218,local_2238,local_2258,0x246,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2290,local_22b0,local_22d0,0x247,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  util::hex_literals::operator___hex<util::hex_literals::detail::Hex<5UL>___170,_0___>();
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffd198,
             (array<std::byte,_2UL> *)in_stack_ffffffffffffd190);
  local_22e0 = CAddress::SerParams::operator()
                         ((SerParams *)in_stack_ffffffffffffd198,
                          (CNetAddr *)in_stack_ffffffffffffd190);
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffd198,
             (ParamsWrapper<CAddress::SerParams,_CNetAddr> *)in_stack_ffffffffffffd190);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),
               in_stack_ffffffffffffd1c0,
               CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    CNetAddr::IsValid(in_stack_ffffffffffffd1a0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2318,local_2338,local_2358,0x24e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd1cf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffd1cf);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffd1cf,in_stack_ffffffffffffd1c8),file
               ,CONCAT17(in_stack_ffffffffffffd1bf,in_stack_ffffffffffffd1b8),
               (const_string *)in_stack_ffffffffffffd1b0);
    in_stack_ffffffffffffd1bf = DataStream::empty((DataStream *)in_stack_ffffffffffffd198);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffd198,
               SUB81((ulong)in_stack_ffffffffffffd190 >> 0x38,0));
    in_stack_ffffffffffffd1b0 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffd190,
               (basic_cstring<const_char> *)in_stack_ffffffffffffd188);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffd198,in_stack_ffffffffffffd190,
               (unsigned_long)in_stack_ffffffffffffd188);
    in_stack_ffffffffffffd188 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2390,local_23b0,local_23d0,0x24f,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffd188);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffd188);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffd188);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_ffffffffffffd188);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_unserialize_v2)
{
    CNetAddr addr;
    DataStream s{};
    const auto ser_params{CAddress::V2_NETWORK};

    // Valid IPv4.
    s << "01"            // network type (IPv4)
         "04"            // address length
         "01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsIPv4());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "1.2.3.4");
    BOOST_REQUIRE(s.empty());

    // Invalid IPv4, valid length but address itself is shorter.
    s << "01"        // network type (IPv4)
         "04"        // address length
         "0102"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure, HasReason("end of data"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv4, with bogus length.
    s << "01"            // network type (IPv4)
         "05"            // address length
         "01020304"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 IPv4 address with length 5 (should be 4)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv4, with extreme length.
    s << "01"            // network type (IPv4)
         "fd0102"        // address length (513 as CompactSize)
         "01020304"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("Address too long: 513 > 512"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid IPv6.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "0102030405060708090a0b0c0d0e0f10"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsIPv6());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "102:304:506:708:90a:b0c:d0e:f10");
    BOOST_REQUIRE(s.empty());

    // Valid IPv6, contains embedded "internal".
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "fd6b88c08724ca978112ca1bbdcafac2"_hex; // address: 0xfd + sha256("bitcoin")[0:5] +
                                                 // sha256(name)[0:10]
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsInternal());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "zklycewkdo64v6wc.internal");
    BOOST_REQUIRE(s.empty());

    // Invalid IPv6, with bogus length.
    s << "02"      // network type (IPv6)
         "04"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 IPv6 address with length 4 (should be 16)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv6, contains embedded IPv4.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "00000000000000000000ffff01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Invalid IPv6, contains embedded TORv2.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "fd87d87eeb430102030405060708090a"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // TORv2, no longer supported.
    s << "03"                        // network type (TORv2)
         "0a"                        // address length
         "f1f2f3f4f5f6f7f8f9fa"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Valid TORv3.
    s << "04"                               // network type (TORv3)
         "20"                               // address length
         "79bcc625184b05194975c28b66b66b04" // address
         "69f7f6556fb1ac3189a79b40dda32f1f"_hex;
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsTor());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(),
                      "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion");
    BOOST_REQUIRE(s.empty());

    // Invalid TORv3, with bogus length.
    s << "04"      // network type (TORv3)
         "00"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 TORv3 address with length 0 (should be 32)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid I2P.
    s << "05"                               // network type (I2P)
         "20"                               // address length
         "a2894dabaec08c0051a481a6dac88b64" // address
         "f98232ae42d4b6fd2fa81952dfe36a87"_hex;
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsI2P());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(),
                      "ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p");
    BOOST_REQUIRE(s.empty());

    // Invalid I2P, with bogus length.
    s << "05"      // network type (I2P)
         "03"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 I2P address with length 3 (should be 32)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid CJDNS.
    s << "06"                                    // network type (CJDNS)
         "10"                                    // address length
         "fc000001000200030004000500060007"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsCJDNS());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "fc00:1:2:3:4:5:6:7");
    BOOST_REQUIRE(s.empty());

    // Invalid CJDNS, wrong prefix.
    s << "06"                                    // network type (CJDNS)
         "10"                                    // address length
         "aa000001000200030004000500060007"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsCJDNS());
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Invalid CJDNS, with bogus length.
    s << "06"      // network type (CJDNS)
         "01"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 CJDNS address with length 1 (should be 16)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Unknown, with extreme length.
    s << "aa"                  // network type (unknown)
         "fe00000002"          // address length (CompactSize's MAX_SIZE)
         "01020304050607"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("Address too long: 33554432 > 512"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Unknown, with reasonable length.
    s << "aa"            // network type (unknown)
         "04"            // address length
         "01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Unknown, with zero length.
    s << "aa"    // network type (unknown)
         "00"    // address length
         ""_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());
}